

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_wrap.c
# Opt level: O1

int mbedtls_pk_error_from_psa(psa_status_t status)

{
  int iVar1;
  
  switch(status) {
  case -0x99:
  case -0x98:
  case -0x92:
    iVar1 = -0x3e00;
    break;
  case -0x97:
    iVar1 = -0x6e;
    break;
  case -0x93:
  case -0x91:
    iVar1 = -0x70;
    break;
  case -0x8d:
    iVar1 = -0x3f80;
    break;
  case -0x8a:
    iVar1 = -0x3880;
    break;
  case -0x89:
    iVar1 = -16000;
    break;
  case -0x88:
    iVar1 = -0x3d00;
    break;
  case -0x87:
    iVar1 = -0x3a80;
    break;
  case -0x86:
    iVar1 = -0x3980;
    break;
  default:
    if (status == 0) {
      return 0;
    }
  case -0x96:
  case -0x95:
  case -0x94:
  case -0x90:
  case -0x8f:
  case -0x8e:
  case -0x8c:
  case -0x8b:
  case -0x85:
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int mbedtls_pk_error_from_psa(psa_status_t status)
{
    switch (status) {
        case PSA_SUCCESS:
            return 0;
        case PSA_ERROR_INVALID_HANDLE:
            return MBEDTLS_ERR_PK_KEY_INVALID_FORMAT;
        case PSA_ERROR_NOT_PERMITTED:
            return MBEDTLS_ERR_ERROR_GENERIC_ERROR;
        case PSA_ERROR_BUFFER_TOO_SMALL:
            return MBEDTLS_ERR_PK_BUFFER_TOO_SMALL;
        case PSA_ERROR_NOT_SUPPORTED:
            return MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE;
        case PSA_ERROR_INVALID_ARGUMENT:
            return MBEDTLS_ERR_PK_INVALID_ALG;
        case PSA_ERROR_INSUFFICIENT_MEMORY:
            return MBEDTLS_ERR_PK_ALLOC_FAILED;
        case PSA_ERROR_BAD_STATE:
            return MBEDTLS_ERR_PK_BAD_INPUT_DATA;
        case PSA_ERROR_COMMUNICATION_FAILURE:
        case PSA_ERROR_HARDWARE_FAILURE:
            return MBEDTLS_ERR_PLATFORM_HW_ACCEL_FAILED;
        case PSA_ERROR_DATA_CORRUPT:
        case PSA_ERROR_DATA_INVALID:
        case PSA_ERROR_STORAGE_FAILURE:
            return MBEDTLS_ERR_PK_FILE_IO_ERROR;
        case PSA_ERROR_CORRUPTION_DETECTED:
            return MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
        default:
            return MBEDTLS_ERR_ERROR_GENERIC_ERROR;
    }
}